

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManComputeDoms(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  ulong uVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  int v;
  int iVar5;
  
  p_00 = p->vDoms;
  if (p_00 == (Vec_Int_t *)0x0) {
    p_00 = Vec_IntAlloc(0);
    p->vDoms = p_00;
  }
  uVar1 = p->nObjs;
  Vec_IntGrow(p_00,uVar1);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    p_00->pArray[uVar3] = -1;
  }
  p_00->nSize = uVar1;
  iVar5 = p->nObjs + -1;
LAB_005000f3:
  do {
    do {
      v = iVar5;
      if (v + 1 < 1) {
        return;
      }
      pObj = Gia_ManObj(p,v);
      if (pObj == (Gia_Obj_t *)0x0) {
        return;
      }
      iVar5 = v + -1;
    } while (v == 0);
    uVar3 = *(ulong *)pObj;
    uVar1 = (uint)uVar3;
  } while (((byte)(uVar3 >> 0x3e) & 1) != 0 || (~uVar1 & 0x9fffffff) == 0);
  if ((p->pRefs != (int *)0x0) && ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1))
  goto code_r0x0050015f;
  goto LAB_00500171;
code_r0x0050015f:
  iVar2 = Gia_ObjRefNum(p,pObj);
  if (iVar2 != 0) {
    uVar3 = *(ulong *)pObj;
LAB_00500171:
    uVar4 = uVar3 & 0x1fffffff;
    if (uVar4 == 0x1fffffff || -1 < (int)uVar3) {
      if (((int)uVar3 < 0) || ((int)uVar4 == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                      ,0x69,"void Gia_ManComputeDoms(Gia_Man_t *)");
      }
      Gia_ManAddDom(p,pObj + -uVar4,v);
      uVar1 = *(uint *)&pObj->field_0x4;
    }
    else {
      Gia_ObjSetDom(p,pObj,v);
      uVar1 = (uint)*(undefined8 *)pObj;
    }
    Gia_ManAddDom(p,pObj + -(ulong)(uVar1 & 0x1fffffff),v);
  }
  goto LAB_005000f3;
}

Assistant:

void Gia_ManComputeDoms( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    if ( p->vDoms == NULL )
        p->vDoms = Vec_IntAlloc( 0 );
    Vec_IntFill( p->vDoms, Gia_ManObjNum(p), -1 );
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( i == 0 || Gia_ObjIsCi(pObj) )
            continue;
        if ( pObj->fMark1 || (p->pRefs && Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p, pObj) == 0) )
            continue;
        if ( Gia_ObjIsCo(pObj) )
        {
            Gia_ObjSetDom( p, pObj, i );
            Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManAddDom( p, Gia_ObjFanin0(pObj), i );
        Gia_ManAddDom( p, Gia_ObjFanin1(pObj), i );
    }
}